

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>),libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *a)

{
  io_context *ctx;
  uint *in_RCX;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_58 [40];
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> local_30;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,this);
  if (local_68._M_ptr != (element_type *)0x0) {
    local_58._0_8_ = ((local_68._M_ptr)->super_torrent_hot_members).m_ses;
    ctx = ((session_impl *)local_58._0_8_)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),
               &local_68);
    local_30.m_val = *in_RCX;
    local_58._24_8_ = f;
    local_58._32_8_ = a;
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>),libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>(void(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>),libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&)const::_lambda()_1_>
              (ctx,(type_conflict9 *)local_58,(type *)0x0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    return;
  }
  local_58._0_4_ = 0x14;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_58);
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}